

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  string *this;
  error_code eVar3;
  path base;
  path local_100;
  path local_e0;
  path local_c0;
  path local_a0;
  path local_80;
  path local_60;
  path local_40;
  
  std::error_code::clear(ec);
  current_path(&local_e0,ec);
  if (ec->_M_value != 0) {
    eVar3 = detail::make_system_error(0);
    ec->_M_value = eVar3._M_value;
    ec->_M_cat = eVar3._M_cat;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_00104e11;
  }
  if ((p->_path)._M_string_length == 0) {
LAB_00104d33:
    operator/(__return_storage_ptr__,&local_e0,p);
  }
  else {
    bVar1 = path::has_root_name(p);
    bVar2 = path::has_root_directory(p);
    if (bVar1) {
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)p);
        goto LAB_00104e11;
      }
      path::root_name(&local_60,p);
      path::root_directory(&local_80,&local_e0);
      operator/(&local_40,&local_60,&local_80);
      path::relative_path(&local_a0,&local_e0);
      operator/(&local_100,&local_40,&local_a0);
      path::relative_path(&local_c0,p);
      operator/(__return_storage_ptr__,&local_100,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
      this = (string *)&local_60;
    }
    else {
      if (!bVar2) goto LAB_00104d33;
      path::root_name(&local_100,&local_e0);
      operator/(__return_storage_ptr__,&local_100,p);
      this = (string *)&local_100;
    }
    std::__cxx11::string::~string(this);
  }
LAB_00104e11:
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(GHC_NATIVEWP(p), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(GHC_NATIVEWP(p), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}